

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

ON__UINT64 __thiscall ON_FileIterator::CurrentItemSize(ON_FileIterator *this)

{
  if (*(long *)(this + 0x30) != 0) {
    return *(ON__UINT64 *)(*(long *)(this + 0x30) + 0x1238);
  }
  return 0;
}

Assistant:

ON__UINT64 ON_FileIterator::CurrentItemSize() const
{
  ON__UINT64 file_size = 0;

  if (nullptr != m_impl)
  {

#if defined(ON_COMPILER_MSC)
    if (0 != m_impl->CurrentFileNameAsPointer())
    {
      file_size = m_impl->m_fd.nFileSizeHigh;
      file_size *= ((ON__UINT64)0xFFFFFFFF);
      file_size += m_impl->m_fd.nFileSizeLow;
    }
#else
    file_size = m_impl->m_current_file_size;
#endif
  }

  return file_size;
}